

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O2

void __thiscall
vkt::synchronization::PipelineCacheData::setFromPipelineCache
          (PipelineCacheData *this,DeviceInterface *vk,VkDevice device,VkPipelineCache pipelineCache
          )

{
  VkResult VVar1;
  deUintptr dataSize;
  size_type local_30;
  
  de::Mutex::lock(&this->m_lock);
  local_30 = 0;
  VVar1 = (*vk->_vptr_DeviceInterface[0x2e])(vk,device,pipelineCache.m_internal,&local_30,0);
  ::vk::checkResult(VVar1,"vk.getPipelineCacheData(device, pipelineCache, &dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationUtil.cpp"
                    ,0x351);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,local_30);
  if (local_30 != 0) {
    VVar1 = (*vk->_vptr_DeviceInterface[0x2e])
                      (vk,device,pipelineCache.m_internal,&local_30,
                       (this->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start);
    ::vk::checkResult(VVar1,"vk.getPipelineCacheData(device, pipelineCache, &dataSize, &m_data[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationUtil.cpp"
                      ,0x356);
  }
  de::Mutex::unlock(&this->m_lock);
  return;
}

Assistant:

void PipelineCacheData::setFromPipelineCache (const vk::DeviceInterface& vk, const vk::VkDevice device, const vk::VkPipelineCache pipelineCache)
{
	const de::ScopedLock		dataLock		(m_lock);
	deUintptr					dataSize		= 0;

	VK_CHECK(vk.getPipelineCacheData(device, pipelineCache, &dataSize, DE_NULL));

	m_data.resize(dataSize);

	if (dataSize > 0)
		VK_CHECK(vk.getPipelineCacheData(device, pipelineCache, &dataSize, &m_data[0]));
}